

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

string * __thiscall
Test::Output::truncateString(string *__return_storage_ptr__,Output *this,string *string,uint length)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  uint local_24;
  string *psStack_20;
  uint length_local;
  string *string_local;
  Output *this_local;
  
  local_24 = length;
  psStack_20 = string;
  string_local = (string *)this;
  this_local = (Output *)__return_storage_ptr__;
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (string);
  if (local_24 < sVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_48,psStack_20,0,(ulong)(local_24 - 3));
    std::operator+(__return_storage_ptr__,&local_48,"...");
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,psStack_20);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Output::truncateString(const std::string &string, unsigned int length) const {
  if (string.size() <= length) {
    return string;
  }
  return string.substr(0, length - 3) + "...";
}